

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O3

void __thiscall ExtraData::parseFullScreen(ExtraData *this)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_20,&(this->CONSOLE_PROPS).FullScreen);
  uVar1 = Utils::lenFourBytes(&local_20);
  if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar1 == 0) {
    pcVar3 = "Full-screen mode is off.";
    lVar2 = 0x18;
  }
  else {
    pcVar3 = "Full-screen mode is on.";
    lVar2 = 0x17;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void ExtraData::parseFullScreen() {
    if (Utils::lenFourBytes(CONSOLE_PROPS.FullScreen) > 0x00000000)
        cout << "Full-screen mode is on." << endl;
    else
        cout << "Full-screen mode is off." << endl;
}